

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O2

MPP_RET allocator_ion_alloc(void *ctx,MppBufferInfo *info)

{
  uint uVar1;
  uint uVar2;
  char *fmt;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar6;
  undefined4 uVar7;
  int fd;
  size_t local_48;
  undefined8 local_40;
  RK_U32 local_38;
  undefined8 local_34;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  fd = -1;
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_ion","os_allocator_close Android do not accept NULL input\n",(char *)0x0);
    return MPP_ERR_NULL_PTR;
  }
  bVar5 = true;
  if (((byte)ion_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_ion","enter: ctx %p size %d\n","allocator_ion_alloc",ctx,info->size);
    bVar5 = ((byte)ion_debug & 1) == 0;
  }
  uVar2 = *(uint *)((long)ctx + 8);
  local_48 = info->size;
  uVar6 = *ctx;
  local_38 = ion_heap_mask;
  local_34 = 0;
  local_40 = uVar6;
  if (!bVar5) {
    _mpp_log_l(4,"mpp_ion","enter: fd %d len %d align %d heap_mask %x flags %x","ion_alloc",
               (ulong)uVar2,local_48,uVar6,ion_heap_mask,0);
    uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
  }
  uVar1 = ion_ioctl(uVar2,-0x3fdfb700,&local_48);
  uVar3 = (ulong)uVar1;
  uVar2 = local_34._4_4_;
  uVar4 = 0xffffffff;
  if (-1 < (int)uVar1) {
    uVar4 = local_34._4_4_;
  }
  if (((byte)ion_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_ion","leave: ret %d\n","ion_alloc",uVar3);
  }
  if (uVar1 == 0) {
    uVar2 = ion_map_fd(*(int *)((long)ctx + 8),uVar2,&fd);
    if (uVar2 == 0) {
      uVar3 = 0;
      goto LAB_0011cd6d;
    }
    uVar3 = (ulong)uVar2;
    fmt = "ion_map_fd failed ret %d\n";
  }
  else {
    fmt = "ion_alloc failed ret %d\n";
  }
  _mpp_log_l(2,"mpp_ion",fmt,"allocator_ion_alloc",uVar3);
LAB_0011cd6d:
  info->fd = fd;
  info->ptr = (void *)0x0;
  info->hnd = (void *)(long)(int)uVar4;
  if (((byte)ion_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_ion","leave: ret %d handle %d fd %d\n","allocator_ion_alloc",uVar3,
               (ulong)uVar4,CONCAT44(uVar7,fd));
  }
  return (MPP_RET)uVar3;
}

Assistant:

static MPP_RET allocator_ion_alloc(void *ctx, MppBufferInfo *info)
{
    MPP_RET ret = MPP_OK;
    int fd = -1;
    ion_user_handle_t hnd = -1;
    allocator_ctx_ion *p = NULL;

    if (NULL == ctx) {
        mpp_err("os_allocator_close Android do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ion_dbg_func("enter: ctx %p size %d\n", ctx, info->size);

    p = (allocator_ctx_ion *)ctx;
    ret = ion_alloc(p->ion_device, info->size, p->alignment, ion_heap_mask,
                    0, &hnd);
    if (ret)
        mpp_err_f("ion_alloc failed ret %d\n", ret);
    else {
        ret = ion_map_fd(p->ion_device, hnd, &fd);
        if (ret)
            mpp_err_f("ion_map_fd failed ret %d\n", ret);
    }

    info->fd  = fd;
    info->ptr = NULL;
    info->hnd = (void *)(intptr_t)hnd;

    ion_dbg_func("leave: ret %d handle %d fd %d\n", ret, hnd, fd);
    return ret;
}